

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::GzipAsyncInputStream::readImpl
          (GzipAsyncInputStream *this,byte *out,size_t minBytes,size_t maxBytes,size_t alreadyRead)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Fault node;
  uint uVar3;
  void *pvVar4;
  PromiseArena *in_R9;
  ulong uVar5;
  int inflateResult;
  undefined4 uStack_74;
  PromiseArena *local_70;
  Fault f;
  Exception *local_60;
  DebugComparison<int,_int> _kjCondition;
  
  local_70 = in_R9;
  if (*(int *)(out + 0x18) == 0) {
    (**(code **)(**(long **)(out + 8) + 8))(&inflateResult,*(long **)(out + 8),out + 0x81,1,0x1000);
    OVar2.ptr = _inflateResult;
    pPVar1 = (_inflateResult->super_PromiseArenaMember).arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)_inflateResult - (long)pPVar1) < 0x48) {
      pvVar4 = operator_new(0x400);
      local_60 = (Exception *)((long)pvVar4 + 0x3b8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_60,(OwnPromiseNode *)&inflateResult,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++:202:15)>
                 ::anon_class_40_5_e4abd3ac_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3b8) = &PTR_destroy_00628cf0;
      *(byte **)((long)pvVar4 + 0x3d8) = out;
      *(size_t *)((long)pvVar4 + 0x3e0) = minBytes;
      *(size_t *)((long)pvVar4 + 1000) = maxBytes;
      *(size_t *)((long)pvVar4 + 0x3f0) = alreadyRead;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = local_70;
      *(void **)((long)pvVar4 + 0x3c0) = pvVar4;
    }
    else {
      (_inflateResult->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      local_60 = (Exception *)&_inflateResult[-5].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_60,(OwnPromiseNode *)&inflateResult,
                 kj::_::
                 SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++:202:15)>
                 ::anon_class_40_5_e4abd3ac_for_func::operator());
      OVar2.ptr[-5].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00628cf0;
      OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)out;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)minBytes;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)maxBytes;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)alreadyRead;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = local_70;
      OVar2.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    f.exception = local_60;
    _kjCondition._0_8_ = &DAT_0048a171;
    _kjCondition.op.content.ptr = "then";
    _kjCondition.op.content.size_ = (size_t)&DAT_4c0000058b;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)&f,(SourceLocation *)&_kjCondition);
    node = f;
    if (f.exception != (Exception *)0x0) {
      f.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
    OVar2.ptr = _inflateResult;
    if (&_inflateResult->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      _inflateResult = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  else {
    *(size_t *)(out + 0x28) = minBytes;
    *(int *)(out + 0x30) = (int)alreadyRead;
    uVar3 = inflate(out + 0x10,0);
    inflateResult = uVar3;
    out[0x80] = uVar3 == 1;
    if (1 < uVar3) {
      if (*(long *)(out + 0x40) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],int&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xeb,FAILED,(char *)0x0,"\"gzip decompression failed\", inflateResult",
                   (char (*) [26])"gzip decompression failed",&inflateResult);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],char*&>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                 ,0xed,FAILED,(char *)0x0,"\"gzip decompression failed\", ctx.msg",
                 (char (*) [26])"gzip decompression failed",(char **)(out + 0x40));
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    if ((uVar3 == 1) && (*(int *)(out + 0x18) != 0)) {
      _kjCondition.left = inflateReset(out + 0x10);
      _kjCondition.right = 0;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.left == 0;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/gzip.c++"
                   ,0xe0,FAILED,"inflateReset(&ctx) == Z_OK","_kjCondition,",&_kjCondition);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    uVar5 = alreadyRead - *(uint *)(out + 0x30);
    if (maxBytes < uVar5 || maxBytes - uVar5 == 0) {
      _kjCondition._0_8_ = uVar5 + (long)local_70;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)this,(unsigned_long *)&_kjCondition);
    }
    else {
      readImpl(this,out,minBytes + uVar5,maxBytes - uVar5,(ulong)*(uint *)(out + 0x30));
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> GzipAsyncInputStream::readImpl(
    byte* out, size_t minBytes, size_t maxBytes, size_t alreadyRead) {
  if (ctx.avail_in == 0) {
    return inner.tryRead(buffer, 1, sizeof(buffer))
        .then([this,out,minBytes,maxBytes,alreadyRead](size_t amount) -> Promise<size_t> {
      if (amount == 0) {
        if (!atValidEndpoint) {
          return KJ_EXCEPTION(DISCONNECTED, "gzip compressed stream ended prematurely");
        }
        return alreadyRead;
      } else {
        ctx.next_in = buffer;
        ctx.avail_in = amount;
        return readImpl(out, minBytes, maxBytes, alreadyRead);
      }
    });
  }

  ctx.next_out = out;
  ctx.avail_out = maxBytes;

  auto inflateResult = inflate(&ctx, Z_NO_FLUSH);
  atValidEndpoint = inflateResult == Z_STREAM_END;
  if (inflateResult == Z_OK || inflateResult == Z_STREAM_END) {
    if (atValidEndpoint && ctx.avail_in > 0) {
      // There's more data available. Assume start of new content.
      KJ_ASSERT(inflateReset(&ctx) == Z_OK);
    }

    size_t n = maxBytes - ctx.avail_out;
    if (n >= minBytes) {
      return n + alreadyRead;
    } else {
      return readImpl(out + n, minBytes - n, maxBytes - n, alreadyRead + n);
    }
  } else {
    if (ctx.msg == nullptr) {
      KJ_FAIL_REQUIRE("gzip decompression failed", inflateResult);
    } else {
      KJ_FAIL_REQUIRE("gzip decompression failed", ctx.msg);
    }
  }
}